

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itoa.h
# Opt level: O0

char * rapidjson::internal::i32toa(int32_t value,char *buffer)

{
  char *pcVar1;
  uint32_t local_1c;
  char *pcStack_18;
  uint32_t u;
  char *buffer_local;
  int32_t value_local;
  
  if (buffer != (char *)0x0) {
    local_1c = value;
    pcStack_18 = buffer;
    if (value < 0) {
      pcStack_18 = buffer + 1;
      *buffer = '-';
      local_1c = (value ^ 0xffffffffU) + 1;
    }
    pcVar1 = u32toa(local_1c,pcStack_18);
    return pcVar1;
  }
  __assert_fail("buffer != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/arnodeceuninck[P]CLizard/src/indiv/rapidjson/internal/itoa.h"
                ,0x74,"char *rapidjson::internal::i32toa(int32_t, char *)");
}

Assistant:

inline char* i32toa(int32_t value, char* buffer) {
    RAPIDJSON_ASSERT(buffer != 0);
    uint32_t u = static_cast<uint32_t>(value);
    if (value < 0) {
        *buffer++ = '-';
        u = ~u + 1;
    }

    return u32toa(u, buffer);
}